

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void qemu_ram_free_s390x(uc_struct_conflict14 *uc,RAMBlock *block)

{
  RAMBlock *pRVar1;
  
  if (block != (RAMBlock *)0x0) {
    pRVar1 = (block->next).le_next;
    if (pRVar1 != (RAMBlock *)0x0) {
      (pRVar1->next).le_prev = (block->next).le_prev;
    }
    *(block->next).le_prev = pRVar1;
    (uc->ram_list).mru_block = (RAMBlock *)0x0;
    (uc->ram_list).freed = true;
    if ((block->flags & 1) == 0) {
      qemu_anon_ram_free((uc_struct *)uc,block->host,block->max_length);
    }
    g_free(block);
    return;
  }
  return;
}

Assistant:

void qemu_ram_free(struct uc_struct *uc, RAMBlock *block)
{
    if (!block) {
        return;
    }

    //if (block->host) {
    //    ram_block_notify_remove(block->host, block->max_length);
    //}

    QLIST_REMOVE_RCU(block, next);
    uc->ram_list.mru_block = NULL;
    uc->ram_list.freed = true;
    /* Write list before version */
    //smp_wmb();
    // call_rcu(block, reclaim_ramblock, rcu);
    reclaim_ramblock(uc, block);
}